

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DensityPlot.cpp
# Opt level: O2

void __thiscall OpenMD::DensityPlot::writeDensity(DensityPlot *this)

{
  char cVar1;
  ostream *poVar2;
  uint uVar3;
  ulong uVar4;
  ofstream ofs;
  
  std::ofstream::ofstream(&ofs,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_bin)
  ;
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    snprintf(painCave.errMsg,2000,"DensityPlot: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::operator<<((ostream *)&ofs,"#g(x, y, z)\n");
    poVar2 = std::operator<<((ostream *)&ofs,"#selection: (");
    poVar2 = std::operator<<(poVar2,(string *)&this->selectionScript_);
    std::operator<<(poVar2,")\n");
    poVar2 = std::operator<<((ostream *)&ofs,"#cmSelection:(");
    poVar2 = std::operator<<(poVar2,(string *)&this->cmSelectionScript_);
    std::operator<<(poVar2,")\n");
    poVar2 = std::operator<<((ostream *)&ofs,"#nRBins = ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->nRBins_);
    std::operator<<(poVar2,"\t maxLen = ");
    poVar2 = std::ostream::_M_insert<double>(this->len_);
    std::operator<<(poVar2,"\tdeltaR = ");
    poVar2 = std::ostream::_M_insert<double>(this->deltaR_);
    std::operator<<(poVar2,"\n");
    for (uVar3 = 0; uVar4 = (ulong)uVar3,
        uVar4 < (ulong)((long)(this->histogram_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->histogram_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2); uVar3 = uVar3 + 1) {
      poVar2 = std::ostream::_M_insert<double>((double)uVar4 * this->deltaR_ - this->halfLen_);
      std::operator<<(poVar2,"\t");
      poVar2 = std::ostream::_M_insert<double>
                         ((this->density_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar4]);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&ofs);
  return;
}

Assistant:

void DensityPlot::writeDensity() {
    std::ofstream ofs(outputFilename_.c_str(), std::ios::binary);
    if (ofs.is_open()) {
      ofs << "#g(x, y, z)\n";
      ofs << "#selection: (" << selectionScript_ << ")\n";
      ofs << "#cmSelection:(" << cmSelectionScript_ << ")\n";
      ofs << "#nRBins = " << nRBins_ << "\t maxLen = " << len_
          << "\tdeltaR = " << deltaR_ << "\n";
      for (unsigned int i = 0; i < histogram_.size(); ++i) {
        ofs << i * deltaR_ - halfLen_ << "\t" << density_[i] << std::endl;
      }
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DensityPlot: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    ofs.close();
  }